

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O0

string * __thiscall
gl4cts::GLSL420Pack::Utils::getVariableName_abi_cxx11_
          (string *__return_storage_ptr__,Utils *this,SHADER_STAGES stage,VARIABLE_STORAGE storage,
          GLchar *variable_name)

{
  GLchar *__s;
  undefined4 in_register_0000000c;
  size_t local_50;
  size_t position;
  allocator<char> local_32;
  undefined1 local_31;
  GLchar *local_30;
  GLchar *prefix;
  GLchar *preceeding;
  GLchar *variable_name_local;
  VARIABLE_STORAGE storage_local;
  SHADER_STAGES stage_local;
  string *name;
  
  __s = getVariableName::variable_name_template;
  preceeding = (GLchar *)CONCAT44(in_register_0000000c,storage);
  variable_name_local._4_4_ = SUB84(this,0);
  prefix = getVariableName::prefixes[stage][(ulong)this & 0xffffffff][0];
  local_30 = *(GLchar **)(((ulong)this & 0xffffffff) * 0x10 + (ulong)stage * 0x60 + 0x32e0d78);
  local_31 = 0;
  variable_name_local._0_4_ = stage;
  _storage_local = __return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,&local_32)
  ;
  std::allocator<char>::~allocator(&local_32);
  local_50 = 0;
  replaceToken(getVariableName::token_preceeding,&local_50,prefix,__return_storage_ptr__);
  replaceToken(getVariableName::token_prefix,&local_50,local_30,__return_storage_ptr__);
  replaceToken(getVariableName::token_variable_name,&local_50,preceeding,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string Utils::getVariableName(SHADER_STAGES stage, VARIABLE_STORAGE storage, const glw::GLchar* variable_name)
{
	/* Variable name template */
	static const GLchar* variable_name_template = "PRECEEDING_PREFIX_VARIABLE_NAME";

	/* Tokens */
	static const GLchar* token_preceeding	= "PRECEEDING";
	static const GLchar* token_prefix		 = "PREFIX";
	static const GLchar* token_variable_name = "VARIABLE_NAME";

	static const GLchar* prefixes[Utils::STORAGE_MAX][Utils::SHADER_STAGES_MAX][2] = {
		/* COMPUTE,					VERTEX,				TCS,				TES,				GEOMETRY,			FRAGMENT					*/
		{ { "", "" },
		  { "in", "vs" },
		  { "vs", "tcs" },
		  { "tcs", "tes" },
		  { "tes", "gs" },
		  { "gs", "fs" } }, /* INPUT	*/
		{ { "", "" },
		  { "vs", "tcs" },
		  { "tcs", "tes" },
		  { "tes", "gs" },
		  { "gs", "fs" },
		  { "fs", "out" } }, /* OUTPUT	*/
		{ { "uni", "comp" },
		  { "uni", "vs" },
		  { "uni", "tcs" },
		  { "uni", "tes" },
		  { "uni", "gs" },
		  { "uni", "fs" } } /* UNIFORM	*/
	};

	/* Variables */
	const GLchar* preceeding = prefixes[storage][stage][0];
	const GLchar* prefix	 = prefixes[storage][stage][1];
	std::string   name		 = variable_name_template;
	size_t		  position   = 0;

	/* Replace tokens */
	Utils::replaceToken(token_preceeding, position, preceeding, name);
	Utils::replaceToken(token_prefix, position, prefix, name);
	Utils::replaceToken(token_variable_name, position, variable_name, name);

	/* Done */
	return name;
}